

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

bool __thiscall particleSamples::decide_to_pick_OSCAR(particleSamples *this,int POI,int monval)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  int strange_1;
  int strange;
  int baryon_1;
  int baryon;
  int charge_2;
  int charge_1;
  int charge;
  bool pick_flag;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  bool local_11;
  
  if (in_ESI == 99999) {
    local_11 = true;
  }
  else {
    iVar1 = (int)((ulong)in_RDI >> 0x20);
    if (in_ESI == 9999) {
      iVar1 = particle_decay::get_particle_charge
                        ((particle_decay *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),iVar1);
      local_11 = iVar1 != 0;
    }
    else if (in_ESI == 0x270e) {
      iVar1 = particle_decay::get_particle_charge
                        ((particle_decay *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),iVar1);
      local_11 = 0 < iVar1;
    }
    else if (in_ESI == -0x270e) {
      iVar1 = particle_decay::get_particle_charge
                        ((particle_decay *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),iVar1);
      local_11 = iVar1 < 0;
    }
    else if (in_ESI == 0x270d) {
      iVar1 = particle_decay::get_particle_baryon_number
                        ((particle_decay *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),iVar1);
      local_11 = 0 < iVar1;
    }
    else if (in_ESI == -0x270d) {
      iVar1 = particle_decay::get_particle_baryon_number
                        ((particle_decay *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),iVar1);
      local_11 = iVar1 < 0;
    }
    else if (in_ESI == 0x270c) {
      iVar1 = particle_decay::get_particle_strange_number
                        ((particle_decay *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),iVar1);
      local_11 = 0 < iVar1;
    }
    else if (in_ESI == -0x270c) {
      iVar1 = particle_decay::get_particle_strange_number
                        ((particle_decay *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),iVar1);
      local_11 = iVar1 < 0;
    }
    else {
      local_11 = in_EDX == in_ESI;
    }
  }
  return local_11;
}

Assistant:

bool particleSamples::decide_to_pick_OSCAR(int POI, int monval) {
    bool pick_flag = false;
    if (POI == 99999) {
        // all particles
        pick_flag = true;
    } else if (POI == 9999) {
        // charged particles
        int charge = decayer_ptr->get_particle_charge(monval);
        if (charge != 0) {
            pick_flag = true;
        }
    } else if (POI == 9998) {
        // positive charged particles
        int charge = decayer_ptr->get_particle_charge(monval);
        if (charge > 0) {
            pick_flag = true;
        }
    } else if (POI == -9998) {
        // negative charged particles
        int charge = decayer_ptr->get_particle_charge(monval);
        if (charge < 0) {
            pick_flag = true;
        }
    } else if (POI == 9997) {
        // baryons
        int baryon = decayer_ptr->get_particle_baryon_number(monval);
        if (baryon > 0) {
            pick_flag = true;
        }
    } else if (POI == -9997) {
        // anti-baryons
        int baryon = decayer_ptr->get_particle_baryon_number(monval);
        if (baryon < 0) {
            pick_flag = true;
        }
    } else if (POI == 9996) {
        // strangeness
        int strange = decayer_ptr->get_particle_strange_number(monval);
        if (strange > 0) {
            pick_flag = true;
        }
    } else if (POI == -9996) {
        // anti-strangeness
        int strange = decayer_ptr->get_particle_strange_number(monval);
        if (strange < 0) {
            pick_flag = true;
        }
    } else {
        if (monval == POI) {
            pick_flag = true;
        }
    }
    return (pick_flag);
}